

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmElseCommand.h
# Opt level: O0

cmCommand * __thiscall cmElseCommand::Clone(cmElseCommand *this)

{
  cmCommand *this_00;
  cmElseCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmElseCommand((cmElseCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmElseCommand;
    }